

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall pbrt::StatsAccumulator::Print(StatsAccumulator *this,FILE *dest)

{
  _Base_ptr p_Var1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar2;
  _Base_ptr p_Var3;
  Stats *pSVar4;
  _Rb_tree_header *p_Var5;
  size_t sVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  size_t bytes;
  size_t bytes_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  long lVar9;
  string ret;
  string title;
  string category;
  int64_t denom;
  double avg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  toPrint;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  key_type local_c8;
  StatsAccumulator *local_a8;
  _Base_ptr local_a0;
  string local_98;
  double local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_70;
  _Rb_tree_node_base *local_40;
  long local_38;
  
  fwrite("Statistics:\n",0xc,1,(FILE *)dest);
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar4 = this->stats;
  p_Var3 = (pSVar4->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pSVar4->counters)._M_t._M_impl.super__Rb_tree_header;
  local_a8 = this;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      if (*(long *)(p_Var3 + 2) != 0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_string_length = 0;
        local_e8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_e8.field_2._M_local_buf[0] = '\0';
        getCategoryAndTitle(*(string **)(p_Var3 + 1),(string *)p_Var3[1]._M_parent,&local_c8);
        pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&local_70,&local_c8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        detail::stringPrintfRecursive<std::__cxx11::string&,long&>
                  (&local_108,"%-42s               %12lu",&local_e8,(long *)(p_Var3 + 2));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar2,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    pSVar4 = local_a8->stats;
  }
  p_Var3 = (pSVar4->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pSVar4->memoryCounters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    local_40 = &p_Var5->_M_header;
    do {
      if (*(long *)(p_Var3 + 2) != 0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_string_length = 0;
        local_e8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_e8.field_2._M_local_buf[0] = '\0';
        local_38 = *(long *)(p_Var3 + 2);
        getCategoryAndTitle(*(string **)(p_Var3 + 1),(string *)p_Var3[1]._M_parent,&local_c8);
        pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&local_70,&local_c8);
        Print(_IO_FILE*)::$_0::operator()[abi_cxx11_(&local_98,*(void **)(p_Var3 + 2),bytes);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string>
                  (&local_108,"%-42s                  %s",&local_e8,&local_98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar2,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        lVar9 = lVar9 + local_38;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_40);
  }
  sVar6 = GetCurrentRSS();
  if (0 < (long)(sVar6 - lVar9)) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Memory","");
    pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)&local_70,&local_c8);
    Print(_IO_FILE*)::$_0::operator()[abi_cxx11_(&local_108,(void *)(sVar6 - lVar9),bytes_00);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    detail::stringPrintfRecursive<char_const(&)[20],std::__cxx11::string>
              (&local_e8,"%-42s                  %s",(char (*) [20])"Unreported / unused",&local_108
              );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(pvVar2,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
  }
  pSVar4 = local_a8->stats;
  p_Var3 = (pSVar4->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pSVar4->intDistributions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      if (*(long *)(p_Var3 + 2) != 0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_string_length = 0;
        local_e8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_e8.field_2._M_local_buf[0] = '\0';
        getCategoryAndTitle(*(string **)(p_Var3 + 1),(string *)p_Var3[1]._M_parent,&local_c8);
        local_98._M_dataplus._M_p =
             (pointer)((double)(long)p_Var3[2]._M_right / (double)*(long *)(p_Var3 + 2));
        pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&local_70,&local_c8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        detail::stringPrintfRecursive<std::__cxx11::string&,double&,long&,long&>
                  (&local_108,"%-42s                      %.3f avg [range %lu - %lu]",&local_e8,
                   (double *)&local_98,(long *)&p_Var3[2]._M_parent,(long *)&p_Var3[2]._M_left);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar2,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    pSVar4 = local_a8->stats;
  }
  p_Var3 = (pSVar4->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pSVar4->floatDistributions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      if (*(long *)(p_Var3 + 2) != 0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_string_length = 0;
        local_e8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_e8.field_2._M_local_buf[0] = '\0';
        getCategoryAndTitle(*(string **)(p_Var3 + 1),(string *)p_Var3[1]._M_parent,&local_c8);
        local_98._M_dataplus._M_p =
             (pointer)((double)p_Var3[2]._M_right / (double)*(long *)(p_Var3 + 2));
        pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&local_70,&local_c8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        detail::stringPrintfRecursive<std::__cxx11::string&,double&,double&,double&>
                  (&local_108,"%-42s                      %.3f avg [range %f - %f]",&local_e8,
                   (double *)&local_98,(double *)&p_Var3[2]._M_parent,(double *)&p_Var3[2]._M_left);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar2,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    pSVar4 = local_a8->stats;
  }
  p_Var3 = (pSVar4->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(pSVar4->percentages)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      if (p_Var3[2]._M_parent != (_Base_ptr)0x0) {
        local_98._M_dataplus._M_p = *(pointer *)(p_Var3 + 2);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_a0 = p_Var3[2]._M_parent;
        getCategoryAndTitle(*(string **)(p_Var3 + 1),(string *)p_Var3[1]._M_parent,&local_c8);
        pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)&local_70,&local_c8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        local_78 = (double)CONCAT44(local_78._4_4_,
                                    ((float)(long)local_98._M_dataplus._M_p * 100.0) /
                                    (float)(long)local_a0);
        detail::stringPrintfRecursive<std::__cxx11::string&,long&,long&,float>
                  (&local_108,"%-42s%12lu / %12lu (%.2f%%)",&local_e8,(long *)&local_98,
                   (long *)&local_a0,(float *)&local_78);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(pvVar2,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
    pSVar4 = local_a8->stats;
  }
  p_Var7 = (pSVar4->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = local_a0;
  p_Var8 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  while (local_70._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8,
        (_Rb_tree_header *)p_Var7 != &(pSVar4->ratios)._M_t._M_impl.super__Rb_tree_header) {
    local_a0 = p_Var7[2]._M_parent;
    if (local_a0 != (_Base_ptr)0x0) {
      local_98._M_dataplus._M_p = *(pointer *)(p_Var7 + 2);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      getCategoryAndTitle(*(string **)(p_Var7 + 1),(string *)p_Var7[1]._M_parent,&local_c8);
      pvVar2 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             *)&local_70,&local_c8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_78 = (double)(long)local_98._M_dataplus._M_p / (double)(long)local_a0;
      detail::stringPrintfRecursive<std::__cxx11::string&,long&,long&,double>
                (&local_108,"%-42s%12lu / %12lu (%.2fx)",&local_e8,(long *)&local_98,
                 (long *)&local_a0,&local_78);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar2,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      p_Var3 = local_a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
        p_Var3 = local_a0;
      }
    }
    local_a0 = p_Var3;
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    p_Var3 = local_a0;
    p_Var8 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  local_a0 = p_Var3;
  if ((_Rb_tree_header *)p_Var8 != &local_70._M_impl.super__Rb_tree_header) {
    do {
      fprintf((FILE *)dest,"  %s\n",*(undefined8 *)(p_Var8 + 1));
      p_Var1 = p_Var8[2]._M_parent;
      for (p_Var3 = *(_Base_ptr *)(p_Var8 + 2); p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
        fprintf((FILE *)dest,"    %s\n",*(undefined8 *)p_Var3);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_70._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

void StatsAccumulator::Print(FILE *dest) {
    fprintf(dest, "Statistics:\n");
    std::map<std::string, std::vector<std::string>> toPrint;

    for (auto &counter : stats->counters) {
        if (counter.second == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(counter.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s               %12" PRIu64, title, counter.second));
    }

    size_t totalMemoryReported = 0;
    auto printBytes = [](size_t bytes) -> std::string {
        float kb = (double)bytes / 1024.;
        if (std::abs(kb) < 1024.)
            return StringPrintf("%9.2f kB", kb);

        float mib = kb / 1024.;
        if (std::abs(mib) < 1024.)
            return StringPrintf("%9.2f MiB", mib);

        float gib = mib / 1024.;
        return StringPrintf("%9.2f GiB", gib);
    };

    for (auto &counter : stats->memoryCounters) {
        if (counter.second == 0)
            continue;
        totalMemoryReported += counter.second;

        std::string category, title;
        getCategoryAndTitle(counter.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s                  %s", title, printBytes(counter.second)));
    }
    int64_t unreportedBytes = GetCurrentRSS() - totalMemoryReported;
    if (unreportedBytes > 0)
        toPrint["Memory"].push_back(StringPrintf("%-42s                  %s",
                                                 "Unreported / unused",
                                                 printBytes(unreportedBytes)));

    for (auto &distrib : stats->intDistributions) {
        const std::string &name = distrib.first;
        if (distrib.second.count == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(name, &category, &title);
        double avg = (double)distrib.second.sum / (double)distrib.second.count;
        toPrint[category].push_back(StringPrintf(
            "%-42s                      %.3f avg [range %" PRIu64 " - %" PRIu64 "]",
            title, avg, distrib.second.min, distrib.second.max));
    }
    for (auto &distrib : stats->floatDistributions) {
        const std::string &name = distrib.first;
        if (distrib.second.count == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(name, &category, &title);
        double avg = (double)distrib.second.sum / (double)distrib.second.count;
        toPrint[category].push_back(
            StringPrintf("%-42s                      %.3f avg [range %f - %f]", title,
                         avg, distrib.second.min, distrib.second.max));
    }
    for (auto &percentage : stats->percentages) {
        if (percentage.second.second == 0)
            continue;
        int64_t num = percentage.second.first;
        int64_t denom = percentage.second.second;
        std::string category, title;
        getCategoryAndTitle(percentage.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s%12" PRIu64 " / %12" PRIu64 " (%.2f%%)", title, num, denom,
                         (100.f * num) / denom));
    }
    for (auto &ratio : stats->ratios) {
        if (ratio.second.second == 0)
            continue;
        int64_t num = ratio.second.first;
        int64_t denom = ratio.second.second;
        std::string category, title;
        getCategoryAndTitle(ratio.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s%12" PRIu64 " / %12" PRIu64 " (%.2fx)", title, num, denom,
                         (double)num / (double)denom));
    }

    for (auto &categories : toPrint) {
        fprintf(dest, "  %s\n", categories.first.c_str());
        for (auto &item : categories.second)
            fprintf(dest, "    %s\n", item.c_str());
    }
}